

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O2

int ncnn::rnn(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint _w;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  int *piVar15;
  void *pvVar16;
  int i;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  float fVar25;
  int local_e8;
  Mat local_78;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  _w = top_blob->w;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,4,opt->workspace_allocator);
  pvVar16 = local_78.data;
  local_e8 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    pvVar8 = bottom_blob->data;
    iVar4 = bottom_blob->w;
    sVar9 = bottom_blob->elemsize;
    pvVar10 = top_blob->data;
    iVar5 = top_blob->w;
    sVar11 = top_blob->elemsize;
    local_e8 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar22 = 0;
    if (0 < (int)_w) {
      uVar22 = (ulong)_w;
    }
    uVar19 = 0;
    if (0 < (int)uVar3) {
      uVar19 = uVar3;
    }
    for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
      uVar17 = ~uVar20 + uVar3;
      if (reverse == 0) {
        uVar17 = uVar20;
      }
      pvVar23 = weight_xc->data;
      iVar6 = weight_xc->w;
      pvVar24 = weight_hc->data;
      iVar7 = weight_hc->w;
      sVar12 = weight_hc->elemsize;
      pvVar13 = bias_c->data;
      sVar14 = weight_xc->elemsize;
      for (uVar21 = 0; uVar21 != uVar22; uVar21 = uVar21 + 1) {
        fVar25 = *(float *)((long)pvVar13 + uVar21 * 4);
        for (uVar18 = 0; uVar2 != uVar18; uVar18 = uVar18 + 1) {
          fVar25 = fVar25 + *(float *)((long)pvVar8 +
                                      uVar18 * 4 + (long)iVar4 * sVar9 * (long)(int)uVar17) *
                            *(float *)((long)pvVar23 + uVar18 * 4);
        }
        for (uVar18 = 0; _w != uVar18; uVar18 = uVar18 + 1) {
          fVar25 = fVar25 + *(float *)((long)hidden_state->data + uVar18 * 4) *
                            *(float *)((long)pvVar24 + uVar18 * 4);
        }
        fVar25 = tanhf(fVar25);
        *(float *)((long)pvVar16 + uVar21 * 4) = fVar25;
        pvVar23 = (void *)((long)pvVar23 + (long)iVar6 * sVar14);
        pvVar24 = (void *)((long)pvVar24 + (long)iVar7 * sVar12);
      }
      pvVar23 = hidden_state->data;
      for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
        uVar1 = *(undefined4 *)((long)pvVar16 + uVar21 * 4);
        *(undefined4 *)((long)pvVar23 + uVar21 * 4) = uVar1;
        *(undefined4 *)((long)pvVar10 + uVar21 * 4 + (long)(int)uVar17 * (long)iVar5 * sVar11) =
             uVar1;
      }
    }
  }
  piVar15 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_e8;
}

Assistant:

static int rnn(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* weight_xc_ptr = weight_xc.row(q);
            const float* weight_hc_ptr = weight_hc.row(q);

            float H = bias_c[q];

            for (int i = 0; i < size; i++)
            {
                H += weight_xc_ptr[i] * x[i];
            }

            for (int i = 0; i < num_output; i++)
            {
                H += weight_hc_ptr[i] * hidden_state[i];
            }

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}